

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_quad_mesh_builder.cc
# Opt level: O3

shared_ptr<lf::mesh::Mesh> __thiscall
lf::mesh::utils::TPQuadMeshBuilder::Build(TPQuadMeshBuilder *this)

{
  double *pdVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  double dVar4;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  DstEvaluatorType dstEvaluator;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *pCVar8;
  QuadO1 *this_00;
  int iVar9;
  ulong uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  uint uVar12;
  long in_RSI;
  uint uVar13;
  long lVar14;
  shared_ptr<lf::mesh::Mesh> sVar15;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  initializer_list<unsigned_int> __l;
  size_type quad_cnt;
  int node_cnt;
  double hy;
  uint no_of_cells;
  double hx;
  coord_t node_coord;
  uint no_of_vertices;
  uint no_of_edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_index_list;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v_idx;
  Matrix<double,_2,_4,_0,_2,_4> quad_geo;
  uint local_1a0;
  int local_19c;
  QuadO1 *local_198;
  double local_190;
  uint local_184;
  ulong local_180;
  double local_178;
  ulong local_170;
  double local_168;
  double local_160;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_158;
  ulong local_130;
  double local_128;
  uint local_120;
  uint local_11c;
  undefined4 *local_118;
  undefined8 uStack_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  pointer local_e8;
  long local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_a8 [2];
  TPQuadMeshBuilder *local_68;
  long local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  uVar12 = *(uint *)(in_RSI + 0x30);
  local_170 = (ulong)uVar12;
  uVar6 = *(uint *)(in_RSI + 0x34);
  local_180 = (ulong)uVar6;
  local_184 = uVar6 * uVar12;
  local_120 = (uVar6 + 1) * (uVar12 + 1);
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)local_120;
  local_11c = (uVar6 + 1) * uVar12 + (uVar12 + 1) * uVar6;
  if (local_184 == 0) {
    (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder = (_func_int **)0x0;
    (this->super_StructuredMeshBuilder).mesh_factory_._M_t.
    super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  }
  else {
    local_160 = *(double *)(in_RSI + 0x20) - *(double *)(in_RSI + 0x10);
    local_190 = *(double *)(in_RSI + 0x28) - *(double *)(in_RSI + 0x18);
    lVar14 = -(ulong)(local_190 <= 0.0);
    auVar3._8_4_ = (int)lVar14;
    auVar3._0_8_ = -(ulong)(local_160 <= 0.0);
    auVar3._12_4_ = (int)((ulong)lVar14 >> 0x20);
    iVar5 = movmskpd(local_184,auVar3);
    if (iVar5 == 0) {
      local_160 = local_160 / (double)local_170;
      local_190 = local_190 / (double)local_180;
      local_68 = this;
      Logger();
      local_a8[0].m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)0x373e1f;
      local_a8[0].m_row = CONCAT44(local_a8[0].m_row._4_4_,0x2c);
      local_a8[0].m_col = 0x373e90;
      loc._8_8_ = local_a8[0].m_row;
      loc.filename = 
      "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
      ;
      loc.funcname = "Build";
      fmt.size_ = 0x45;
      fmt.data_ = "TPQuadmesh: {} cells, {} edges, {} vertices, meshwidths hx/hy = {}/{}";
      spdlog::logger::
      log_<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,double_const&,double_const&>
                (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,loc,debug,fmt,&local_184,&local_11c,&local_120,&local_160,&local_190);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_c0,(ulong)local_120,(allocator_type *)local_a8);
      local_19c = 0;
      uVar12 = 0;
      do {
        local_178 = (double)CONCAT44(local_178._4_4_,uVar12);
        local_168 = (double)uVar12;
        uVar12 = 0;
        do {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_158,2);
          local_158.m_xpr =
               (Matrix<double,_2,_4,_0,_2,_4> *)
               ((double)uVar12 * local_160 + *(double *)(in_RSI + 0x10));
          local_a8[0].m_row = 0;
          local_a8[0].m_col = 1;
          local_a8[0].m_currentBlockRows = 1;
          local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(local_190 * local_168 + *(double *)(in_RSI + 0x18));
          local_a8[0].m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)&local_158;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                    (local_a8,(Scalar *)&local_100);
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(local_a8);
          Logger();
          local_a8[0].m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)0x373e1f;
          local_a8[0].m_row = CONCAT44(local_a8[0].m_row._4_4_,0x39);
          local_a8[0].m_col = 0x373e90;
          loc_00._8_8_ = local_a8[0].m_row;
          loc_00.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
          ;
          loc_00.funcname = "Build";
          fmt_00.size_ = 0x14;
          fmt_00.data_ = "Adding vertex {}: {}";
          local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_158;
          spdlog::logger::log_<int&,Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
                    (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,loc_00,trace,fmt_00,&local_19c,
                     (Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_100);
          plVar2 = *(long **)(in_RSI + 8);
          local_118 = (undefined4 *)0x0;
          uStack_110 = 0;
          local_118 = (undefined4 *)Eigen::internal::aligned_malloc(0x10);
          uStack_110 = 2;
          *local_118 = local_158.m_xpr._0_4_;
          local_118[1] = local_158.m_xpr._4_4_;
          local_118[2] = (undefined4)local_158.m_row;
          local_118[3] = local_158.m_row._4_4_;
          uVar6 = (**(code **)(*plVar2 + 0x10))(plVar2,&local_118);
          local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[local_19c] = uVar6;
          free(local_118);
          uVar12 = uVar12 + 1;
          local_19c = local_19c + 1;
        } while (uVar12 <= (uint)local_170);
        uVar12 = local_178._0_4_ + 1;
      } while (uVar12 <= (uint)local_180);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_100,(ulong)local_184,(allocator_type *)local_a8);
      local_1a0 = 0;
      if ((uint)local_170 != 0) {
        uVar12 = 0;
        local_60 = in_RSI;
        do {
          local_130 = (ulong)(uVar12 + 1);
          if ((uint)local_180 != 0) {
            local_178 = (double)uVar12;
            local_168 = (double)local_130;
            uVar6 = 0;
            do {
              iVar5 = *(int *)(in_RSI + 0x30) + 1;
              iVar9 = iVar5 * uVar6;
              local_a8[0].m_xpr =
                   (Matrix<double,_2,_1,_0,_2,_1> *)
                   CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [(uint)(iVar9 + (int)local_130)],
                            local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar9 + uVar12]);
              uVar13 = uVar6 + 1;
              iVar5 = iVar5 * uVar13;
              local_a8[0].m_row =
                   CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar5 + uVar12],
                            local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [(uint)(iVar5 + (int)local_130)]);
              __l._M_len = 4;
              __l._M_array = (iterator)local_a8;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_d8,__l,(allocator_type *)&local_158);
              Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_a8,2,4);
              local_a8[0].m_xpr =
                   (Matrix<double,_2,_1,_0,_2,_1> *)
                   (local_178 * local_160 + *(double *)(in_RSI + 0x10));
              local_158.m_row = 0;
              local_158.m_col = 1;
              local_158.m_currentBlockRows = 1;
              local_e8 = (pointer)(local_160 * local_168 + *(double *)(in_RSI + 0x10));
              local_158.m_xpr = (Matrix<double,_2,_4,_0,_2,_4> *)local_a8;
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (&local_158,(Scalar *)&local_e8);
              local_198 = (QuadO1 *)(local_160 * local_168 + *(double *)(in_RSI + 0x10));
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (pCVar8,(Scalar *)&local_198);
              local_38 = local_160 * local_178 + *(double *)(in_RSI + 0x10);
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (pCVar8,&local_38);
              local_128 = (double)uVar6;
              local_40 = local_190 * local_128 + *(double *)(in_RSI + 0x18);
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (pCVar8,&local_40);
              local_48 = local_128 * local_190 + *(double *)(in_RSI + 0x18);
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (pCVar8,&local_48);
              local_128 = (double)uVar13;
              local_50 = local_190 * local_128 + *(double *)(in_RSI + 0x18);
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                                 (pCVar8,&local_50);
              local_58 = local_128 * local_190 + *(double *)(in_RSI + 0x18);
              Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                        (pCVar8,&local_58);
              Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::finished(&local_158);
              Logger();
              local_158.m_xpr = (Matrix<double,_2,_4,_0,_2,_4> *)0x373e1f;
              local_158.m_row = CONCAT44(local_158.m_row._4_4_,0x54);
              local_158.m_col = 0x373e90;
              loc_01._8_8_ = local_158.m_row;
              loc_01.filename =
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
              ;
              loc_01.funcname = "Build";
              fmt_01.size_ = 0x12;
              fmt_01.data_ = "Adding quad {}:\n{}";
              spdlog::logger::log_<unsigned_int&,Eigen::Matrix<double,2,4,0,2,4>&>
                        (Logger::logger.
                         super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         loc_01,trace,fmt_01,&local_1a0,(Matrix<double,_2,_4,_0,_2,_4> *)local_a8);
              plVar2 = *(long **)(in_RSI + 8);
              local_e0 = (long)local_d8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_d8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
              local_e8 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              this_00 = (QuadO1 *)operator_new(0x18);
              local_158.m_xpr = (Matrix<double,_2,_4,_0,_2,_4> *)0x0;
              local_158.m_row = 0;
              local_158.m_xpr =
                   (Matrix<double,_2,_4,_0,_2,_4> *)Eigen::internal::aligned_malloc(0x40);
              local_158.m_row = 2;
              uVar10 = 0xfffffffffffffffe;
              do {
                dVar4 = (double)(&local_a8[0].m_currentBlockRows)[uVar10];
                pdVar1 = ((local_158.m_xpr)->
                         super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.
                         m_data.array + uVar10 + 2;
                *pdVar1 = (double)(&local_a8[0].m_col)[uVar10];
                pdVar1[1] = dVar4;
                uVar10 = uVar10 + 2;
              } while (uVar10 < 6);
              geometry::QuadO1::QuadO1(this_00,(Matrix<double,__1,_4,_0,__1,_4> *)&local_158);
              free(local_158.m_xpr);
              local_198 = this_00;
              uVar7 = (**(code **)(*plVar2 + 0x20))(plVar2,4,&local_e8,&local_198);
              *(undefined4 *)
               ((long)(((DenseStorage<double,_2,_2,_1,_0> *)
                       local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)->m_data).array +
               (ulong)local_1a0 * 4) = uVar7;
              if (local_198 != (QuadO1 *)0x0) {
                (*(local_198->super_Geometry)._vptr_Geometry[0xb])();
              }
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_1a0 = local_1a0 + 1;
              in_RSI = local_60;
              uVar6 = uVar13;
            } while (uVar13 != (uint)local_180);
          }
          uVar12 = (uint)local_130;
        } while (uVar12 != (uint)local_170);
      }
      this = local_68;
      (**(code **)(**(long **)(in_RSI + 8) + 0x28))(local_68);
      _Var11._M_pi = extraout_RDX;
      if ((CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
          local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)0x0) {
        operator_delete(local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var11._M_pi = extraout_RDX_00;
      }
      if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var11._M_pi = extraout_RDX_01;
      }
    }
    else {
      (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder = (_func_int **)0x0;
      (this->super_StructuredMeshBuilder).mesh_factory_._M_t.
      super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t
      .super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
    }
  }
  sVar15.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar15.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar15.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<mesh::Mesh> TPQuadMeshBuilder::Build() {
  using coord_t = Eigen::Vector2d;
  const size_type nx = num_of_x_cells_;
  const size_type ny = num_of_y_cells_;
  // Total number of entities in the mesh
  // Each triangle is split into two squares
  const unsigned no_of_cells = nx * ny;  // no of rectangles
  const unsigned no_of_edges = (nx + 1) * ny + nx * (ny + 1);
  const unsigned no_of_vertices = (nx + 1) * (ny + 1);
  // No mesh to build
  if (no_of_cells == 0) {
    return nullptr;
  }
  // define rectangle; return if none
  const double x_size = top_right_corner_[0] - bottom_left_corner_[0];
  const double y_size = top_right_corner_[1] - bottom_left_corner_[1];
  if ((x_size <= 0.0) || (y_size <= 0.0)) {
    return nullptr;
  }
  // meshwidths
  const double hx = x_size / nx;
  const double hy = y_size / ny;

  SPDLOG_LOGGER_DEBUG(
      Logger(),
      "TPQuadmesh: {} cells, {} edges, {} vertices, meshwidths hx/hy = {}/{}",
      no_of_cells, no_of_edges, no_of_vertices, hx, hy);

  // Initialize vertices
  std::vector<size_type> v_idx(no_of_vertices);
  int node_cnt = 0;  // index of current vertex: lexicographic numbering
  for (size_type j = 0; j <= ny; ++j) {
    for (size_type i = 0; i <= nx; ++i, ++node_cnt) {
      // Tensor-product node locations
      coord_t node_coord(2);
      node_coord << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[1] + j * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding vertex {}: {}", node_cnt,
                          node_coord.transpose());

      // Register vertex
      v_idx[node_cnt] = mesh_factory_->AddPoint(node_coord);
    }
  }
  // Set quadrilateral cells
  // Index remapping for cells
  std::vector<size_type> t_idx(no_of_cells);

  size_type quad_cnt = 0;  // index of current triangle
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, quad_cnt++) {
      // Indices of vertices of quadrilateral (i,j)
      std::vector<size_type> vertex_index_list{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j)],
          v_idx[VertexIndex(i + 1, j + 1)], v_idx[VertexIndex(i, j + 1)]};
      // Construct geometry of rectangle
      Eigen::Matrix<double, 2, 4> quad_geo(2, 4);
      quad_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding quad {}:\n{}", quad_cnt, quad_geo);

      // Request production of the cell from the MeshFactory
      // Straight edges will be created as needed
      t_idx[quad_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kQuad(), vertex_index_list,
          std::make_unique<geometry::QuadO1>(quad_geo));
    }
  }
  return mesh_factory_->Build();
}